

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxShape.h
# Opt level: O2

void __thiscall cbtBoxShape::getEdge(cbtBoxShape *this,int i,cbtVector3 *pa,cbtVector3 *pb)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = 0;
  if ((uint)i < 0xc) {
    uVar2 = (ulong)*(uint *)(&DAT_00f5dcc8 + (ulong)(uint)i * 4);
    uVar1 = *(uint *)(&DAT_00f5dcf8 + (ulong)(uint)i * 4);
  }
  (*(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0x1c])(this,uVar2);
  (*(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0x1c])(this,(ulong)uVar1,pb);
  return;
}

Assistant:

virtual void getEdge(int i, cbtVector3& pa, cbtVector3& pb) const
	//virtual void getEdge(int i,Edge& edge) const
	{
		int edgeVert0 = 0;
		int edgeVert1 = 0;

		switch (i)
		{
			case 0:
				edgeVert0 = 0;
				edgeVert1 = 1;
				break;
			case 1:
				edgeVert0 = 0;
				edgeVert1 = 2;
				break;
			case 2:
				edgeVert0 = 1;
				edgeVert1 = 3;

				break;
			case 3:
				edgeVert0 = 2;
				edgeVert1 = 3;
				break;
			case 4:
				edgeVert0 = 0;
				edgeVert1 = 4;
				break;
			case 5:
				edgeVert0 = 1;
				edgeVert1 = 5;

				break;
			case 6:
				edgeVert0 = 2;
				edgeVert1 = 6;
				break;
			case 7:
				edgeVert0 = 3;
				edgeVert1 = 7;
				break;
			case 8:
				edgeVert0 = 4;
				edgeVert1 = 5;
				break;
			case 9:
				edgeVert0 = 4;
				edgeVert1 = 6;
				break;
			case 10:
				edgeVert0 = 5;
				edgeVert1 = 7;
				break;
			case 11:
				edgeVert0 = 6;
				edgeVert1 = 7;
				break;
			default:
				cbtAssert(0);
		}

		getVertex(edgeVert0, pa);
		getVertex(edgeVert1, pb);
	}